

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O3

shared_ptr<const_pstore::repo::linked_definitions> __thiscall
pstore::repo::linked_definitions::load
          (linked_definitions *this,database *db,typed_address<pstore::repo::linked_definitions> ld)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_pstore::repo::linked_definitions> sVar2;
  shared_ptr<const_pstore::repo::linked_definitions> ln;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  database::getro<pstore::repo::linked_definitions,void>
            ((database *)&stack0xffffffffffffffd0,
             (typed_address<pstore::repo::linked_definitions>)db,(size_t)ld.a_.a_);
  sVar2 = database::getro<pstore::repo::linked_definitions,void>
                    ((database *)this,(typed_address<pstore::repo::linked_definitions>)db,
                     (size_t)ld.a_.a_);
  _Var1 = sVar2.
          super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
      (array<pstore::sat_entry,_65536UL> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_28._M_t.
               super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
               .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl)
    ;
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_pstore::repo::linked_definitions>)
         sVar2.
         super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<linked_definitions const>
        linked_definitions::load (database const & db, typed_address<linked_definitions> const ld) {
            // First work out its size, then read the full-size of the object.
            std::shared_ptr<linked_definitions const> const ln = db.getro (ld);
            return db.getro (ld, linked_definitions::size_bytes (ln->size ()));
        }